

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NamedParamAssignmentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedParamAssignmentSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2,ExpressionSyntax **args_3,
          Token *args_4)

{
  Token dot;
  Token name;
  Token openParen;
  Token closeParen;
  NamedParamAssignmentSyntax *this_00;
  Token *args_local_4;
  ExpressionSyntax **args_local_3;
  Token *args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (NamedParamAssignmentSyntax *)allocate(this,0x58,8);
  dot.kind = args->kind;
  dot._2_1_ = args->field_0x2;
  dot.numFlags.raw = (args->numFlags).raw;
  dot.rawLen = args->rawLen;
  dot.info = args->info;
  name.kind = args_1->kind;
  name._2_1_ = args_1->field_0x2;
  name.numFlags.raw = (args_1->numFlags).raw;
  name.rawLen = args_1->rawLen;
  name.info = args_1->info;
  openParen.kind = args_2->kind;
  openParen._2_1_ = args_2->field_0x2;
  openParen.numFlags.raw = (args_2->numFlags).raw;
  openParen.rawLen = args_2->rawLen;
  openParen.info = args_2->info;
  closeParen.kind = args_4->kind;
  closeParen._2_1_ = args_4->field_0x2;
  closeParen.numFlags.raw = (args_4->numFlags).raw;
  closeParen.rawLen = args_4->rawLen;
  closeParen.info = args_4->info;
  slang::syntax::NamedParamAssignmentSyntax::NamedParamAssignmentSyntax
            (this_00,dot,name,openParen,*args_3,closeParen);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }